

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

CTcCodeLabel * CTcPrsNode::new_label_here(void)

{
  CTcCodeLabel *pCVar1;
  CTcCodeStream *unaff_retaddr;
  
  CTcGenTarg::clear_peephole(G_cg);
  pCVar1 = CTcCodeStream::new_label_here(unaff_retaddr);
  return pCVar1;
}

Assistant:

CTcCodeLabel *CTcPrsNode::new_label_here()
{
    /* 
     *   suppress any peephole optimizations at this point -- someone
     *   could jump directly to this instruction, so we can't combine an
     *   instruction destined for this point with anything previous 
     */
    G_cg->clear_peephole();

    /* create and return a label at the current position */
    return G_cs->new_label_here();
}